

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

Bool prvTidyIsXMLLetter(uint c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (((((0x58 < c - 0x250) && (0x1d < c - 0x1fa)) && (uVar2 = c & 0xfffffffe, uVar2 != 500)) &&
      ((0x23 < c - 0x1cd && (0x43 < c - 0x180)))) &&
     ((((0x34 < c - 0x14a && ((7 < c - 0x141 && (10 < c - 0x134)))) && (0x31 < c - 0x100)) &&
      (((((uVar1 = c & 0xfffffff8, uVar1 != 0xf8 && (0x1e < c - 0xd8)) && (0x16 < c - 0xc0)) &&
        (((((((0x19 < (c & 0xffffffdf) - 0x41 && (6 < c - 699)) &&
             ((6 < c - 0x386 || ((0x5dU >> (c - 0x386 & 0x1f) & 1) == 0)))) &&
            (0x2b < c - 0x3a3 && 0x13 < c - 0x38e)) &&
           (((0x10 < c - 0x3d0 || ((0x1547fU >> (c - 0x3d0 & 0x1f) & 1) == 0)) &&
            ((uVar2 != 0x4f8 && (((7 < c - 0x4ee && (0x1b < c - 0x4d0)) && (1 < c - 0x4cb)))))))) &&
          (((1 < c - 0x4c7 && (0x34 < c - 0x490)) && (0x23 < c - 0x45e)))) &&
         ((0xb < c - 0x451 && (0x41 < c - 0x40e)))))) &&
       (((0x11 < c - 0x3e2 &&
         ((((0xb < c - 0x401 && (0xe < c - 0x6c0)) && (4 < c - 0x6ba)) &&
          ((0x46 < c - 0x671 && (9 < c - 0x641)))))) &&
        (((0x19 < c - 0x621 && ((2 < c - 0x5f0 && (0x1a < c - 0x5d0)))) &&
         ((((0x25 < c - 0x561 &&
            (((c != 0x559 && (0x25 < c - 0x531)) && (uVar3 = c & 0xfffffffc, uVar3 != 0x6d0)))) &&
           (((0x11 < c - 0x6d5 || ((0x30001U >> (c - 0x6d5 & 0x1f) & 1) == 0)) && (0x15 < c - 0x993)
            ))) && (((1 < c - 0x98f && (7 < c - 0x985)) &&
                    ((9 < c - 0x958 && ((c != 0x93d && (0x34 < c - 0x905)))))))))))))))))) {
    if (c - 0x9aa < 9) {
      if ((0x17fU >> (c - 0x9aa & 0x1f) & 1) != 0) {
        return yes;
      }
    }
    else if (c - 0xa13 < 0x16) {
      return yes;
    }
    if (((0x34 < c - 0xa2a) || ((0x1780000000db7fU >> ((ulong)(c - 0xa2a) & 0x3f) & 1) == 0)) &&
       (((0x34 < c - 0x9dc || ((0x187e000030003bU >> ((ulong)(c - 0x9dc) & 0x3f) & 1) == 0)) &&
        ((3 < c - 0x9b6 && (2 < c - 0xa72)))))) {
      if (c - 0xa85 < 9) {
        if ((0x17fU >> (c - 0xa85 & 0x1f) & 1) != 0) {
          return yes;
        }
      }
      else if (c - 0xa93 < 0x16) {
        return yes;
      }
      if ((((((0x36 < c - 0xaaa) || ((0x4000000008fb7fU >> ((ulong)(c - 0xaaa) & 0x3f) & 1) == 0))
            && (2 < c - 0xa8f)) &&
           ((0x15 < c - 0xb13 &&
            ((0x38 < c - 0xb05 || ((0x11e6fe000000cffU >> ((ulong)(c - 0xb05) & 0x3f) & 1) == 0)))))
           ) && ((0x3d < c - 0xb5f ||
                 ((0x2c7b8fc000000007U >> ((ulong)(c - 0xb5f) & 0x3f) & 1) == 0)))) &&
         (((((((1 < c - 0xb5c && (9 < c - 0xcaa)) &&
              ((0x16 < c - 0xc92 &&
               ((((((2 < c - 0xc8e && (7 < c - 0xc85)) && (uVar2 != 0xc60)) &&
                  ((4 < c - 0xc35 && (9 < c - 0xc2a)))) && (0x16 < c - 0xc12)) &&
                ((2 < c - 0xc0e && (7 < c - 0xc05)))))))) && (2 < c - 2999)) &&
            (((((7 < c - 0xbae && (2 < c - 0xba8)) && (uVar2 != 0xb9e)) &&
              (((1 < c - 0xba3 && (4 < c - 0xcb5)) &&
               ((c != 0xcde && ((0x2d < c - 0xe01 && (uVar2 != 0xd60)))))))) &&
             ((0xf < c - 0xd2a &&
              ((((0x16 < c - 0xd12 && (2 < c - 0xd0e)) && (uVar2 != 0xce0)) &&
               ((7 < c - 0xd05 &&
                ((0x15 < c - 0xe30 || ((0x3f000dU >> (c - 0xe30 & 0x1f) & 1) == 0)))))))))))) &&
           ((0xc < c - 0xe81 || ((0x12cbU >> (c - 0xe81 & 0x1f) & 1) == 0)))) &&
          (6 < c - 0xe99 && uVar3 != 0xe94)))) {
        if (c - 0xea1 < 7) {
          if (uVar2 == 0xeaa || (0x57U >> ((byte)(c - 0xea1) & 0x1f) & 1) != 0) {
            return yes;
          }
        }
        else if (uVar2 == 0xeaa) {
          return yes;
        }
        if (((0x10 < c - 0xead) || ((0x1006bU >> (c - 0xead & 0x1f) & 1) == 0)) &&
           ((0x26 < c - 0x10d0 &&
            ((((0x25 < c - 0x10a0 && (0x20 < c - 0xf49)) && (4 < c - 0xec0)) && (uVar1 != 0xf40)))))
           ) {
          if (c - 0x1100 < 10) {
            if (c - 0x110b < 2 || (0x2edU >> ((byte)(c - 0x1100) & 0x1f) & 1) != 0) {
              return yes;
            }
          }
          else if (c - 0x110b < 2) {
            return yes;
          }
          if ((((0x2d < c - 0x113c) || ((0x2ab823150015U >> ((ulong)(c - 0x113c) & 0x3f) & 1) == 0))
              && ((((4 < c - 0x110e && (1 < c - 0x116d)) &&
                   (((((0x39 < c - 0x1172 ||
                       ((0x24010000000000bU >> ((ulong)(c - 0x1172) & 0x3f) & 1) == 0)) &&
                      (uVar2 != 0x11ae)) &&
                     (((0x3f < c - 0x11ba ||
                       ((0x80420000000001fdU >> ((ulong)(c - 0x11ba) & 0x3f) & 1) == 0)) &&
                      (1 < c - 0x11b7)))) && ((5 < c - 0x1f48 && (0x25 < c - 0x1f20)))))) &&
                  (((((5 < c - 0x1f18 && ((0x15 < c - 0x1f00 && (0x9b < c - 0x1e00)))) &&
                     (0x59 < c - 0x1ea0)) &&
                    (((((0x34 < c - 0x1f80 && (0x1e < c - 0x1f5f)) && (c != 0x1f5d)) &&
                      ((uVar1 != 0x1f50 && ((c & 0xfffffffd) != 0x1f59)))) &&
                     ((8 < c - 0x1fb6 || ((0x17fU >> (c - 0x1fb6 & 0x1f) & 1) == 0)))))) &&
                   ((((2 < c - 0x1ff2 && (0xc < c - 0x1fe0)) && (5 < c - 0x1fd6)) &&
                    (((((uVar3 != 0x1fd0 && (2 < c - 0x1fc2)) && (6 < c - 0x1fc6)) &&
                      (6 < c - 0x1ff6)) &&
                     (((8 < c - 0x2126 || ((0x131U >> (c - 0x2126 & 0x1f) & 1) == 0)) &&
                      ((0x2ba3 < c - 0xac00 && ((0x27 < c - 0x3105 && (0x59 < c - 0x30a1))))))))))))
                  )))) && ((2 < c - 0x2180 && (0x53 < c - 0x3041)))) {
            return (Bool)((c - 0x3021 < 9 || c - 0x4e00 < 0x51a6) || c == 0x3007);
          }
        }
      }
    }
  }
  return yes;
}

Assistant:

Bool TY_(IsXMLLetter)(uint c)
{
    return ((c >= 0x41 && c <= 0x5a) ||
        (c >= 0x61 && c <= 0x7a) ||
        (c >= 0xc0 && c <= 0xd6) ||
        (c >= 0xd8 && c <= 0xf6) ||
        (c >= 0xf8 && c <= 0xff) ||
        (c >= 0x100 && c <= 0x131) ||
        (c >= 0x134 && c <= 0x13e) ||
        (c >= 0x141 && c <= 0x148) ||
        (c >= 0x14a && c <= 0x17e) ||
        (c >= 0x180 && c <= 0x1c3) ||
        (c >= 0x1cd && c <= 0x1f0) ||
        (c >= 0x1f4 && c <= 0x1f5) ||
        (c >= 0x1fa && c <= 0x217) ||
        (c >= 0x250 && c <= 0x2a8) ||
        (c >= 0x2bb && c <= 0x2c1) ||
        c == 0x386 ||
        (c >= 0x388 && c <= 0x38a) ||
        c == 0x38c ||
        (c >= 0x38e && c <= 0x3a1) ||
        (c >= 0x3a3 && c <= 0x3ce) ||
        (c >= 0x3d0 && c <= 0x3d6) ||
        c == 0x3da ||
        c == 0x3dc ||
        c == 0x3de ||
        c == 0x3e0 ||
        (c >= 0x3e2 && c <= 0x3f3) ||
        (c >= 0x401 && c <= 0x40c) ||
        (c >= 0x40e && c <= 0x44f) ||
        (c >= 0x451 && c <= 0x45c) ||
        (c >= 0x45e && c <= 0x481) ||
        (c >= 0x490 && c <= 0x4c4) ||
        (c >= 0x4c7 && c <= 0x4c8) ||
        (c >= 0x4cb && c <= 0x4cc) ||
        (c >= 0x4d0 && c <= 0x4eb) ||
        (c >= 0x4ee && c <= 0x4f5) ||
        (c >= 0x4f8 && c <= 0x4f9) ||
        (c >= 0x531 && c <= 0x556) ||
        c == 0x559 ||
        (c >= 0x561 && c <= 0x586) ||
        (c >= 0x5d0 && c <= 0x5ea) ||
        (c >= 0x5f0 && c <= 0x5f2) ||
        (c >= 0x621 && c <= 0x63a) ||
        (c >= 0x641 && c <= 0x64a) ||
        (c >= 0x671 && c <= 0x6b7) ||
        (c >= 0x6ba && c <= 0x6be) ||
        (c >= 0x6c0 && c <= 0x6ce) ||
        (c >= 0x6d0 && c <= 0x6d3) ||
        c == 0x6d5 ||
        (c >= 0x6e5 && c <= 0x6e6) ||
        (c >= 0x905 && c <= 0x939) ||
        c == 0x93d ||
        (c >= 0x958 && c <= 0x961) ||
        (c >= 0x985 && c <= 0x98c) ||
        (c >= 0x98f && c <= 0x990) ||
        (c >= 0x993 && c <= 0x9a8) ||
        (c >= 0x9aa && c <= 0x9b0) ||
        c == 0x9b2 ||
        (c >= 0x9b6 && c <= 0x9b9) ||
        (c >= 0x9dc && c <= 0x9dd) ||
        (c >= 0x9df && c <= 0x9e1) ||
        (c >= 0x9f0 && c <= 0x9f1) ||
        (c >= 0xa05 && c <= 0xa0a) ||
        (c >= 0xa0f && c <= 0xa10) ||
        (c >= 0xa13 && c <= 0xa28) ||
        (c >= 0xa2a && c <= 0xa30) ||
        (c >= 0xa32 && c <= 0xa33) ||
        (c >= 0xa35 && c <= 0xa36) ||
        (c >= 0xa38 && c <= 0xa39) ||
        (c >= 0xa59 && c <= 0xa5c) ||
        c == 0xa5e ||
        (c >= 0xa72 && c <= 0xa74) ||
        (c >= 0xa85 && c <= 0xa8b) ||
        c == 0xa8d ||
        (c >= 0xa8f && c <= 0xa91) ||
        (c >= 0xa93 && c <= 0xaa8) ||
        (c >= 0xaaa && c <= 0xab0) ||
        (c >= 0xab2 && c <= 0xab3) ||
        (c >= 0xab5 && c <= 0xab9) ||
        c == 0xabd ||
        c == 0xae0 ||
        (c >= 0xb05 && c <= 0xb0c) ||
        (c >= 0xb0f && c <= 0xb10) ||
        (c >= 0xb13 && c <= 0xb28) ||
        (c >= 0xb2a && c <= 0xb30) ||
        (c >= 0xb32 && c <= 0xb33) ||
        (c >= 0xb36 && c <= 0xb39) ||
        c == 0xb3d ||
        (c >= 0xb5c && c <= 0xb5d) ||
        (c >= 0xb5f && c <= 0xb61) ||
        (c >= 0xb85 && c <= 0xb8a) ||
        (c >= 0xb8e && c <= 0xb90) ||
        (c >= 0xb92 && c <= 0xb95) ||
        (c >= 0xb99 && c <= 0xb9a) ||
        c == 0xb9c ||
        (c >= 0xb9e && c <= 0xb9f) ||
        (c >= 0xba3 && c <= 0xba4) ||
        (c >= 0xba8 && c <= 0xbaa) ||
        (c >= 0xbae && c <= 0xbb5) ||
        (c >= 0xbb7 && c <= 0xbb9) ||
        (c >= 0xc05 && c <= 0xc0c) ||
        (c >= 0xc0e && c <= 0xc10) ||
        (c >= 0xc12 && c <= 0xc28) ||
        (c >= 0xc2a && c <= 0xc33) ||
        (c >= 0xc35 && c <= 0xc39) ||
        (c >= 0xc60 && c <= 0xc61) ||
        (c >= 0xc85 && c <= 0xc8c) ||
        (c >= 0xc8e && c <= 0xc90) ||
        (c >= 0xc92 && c <= 0xca8) ||
        (c >= 0xcaa && c <= 0xcb3) ||
        (c >= 0xcb5 && c <= 0xcb9) ||
        c == 0xcde ||
        (c >= 0xce0 && c <= 0xce1) ||
        (c >= 0xd05 && c <= 0xd0c) ||
        (c >= 0xd0e && c <= 0xd10) ||
        (c >= 0xd12 && c <= 0xd28) ||
        (c >= 0xd2a && c <= 0xd39) ||
        (c >= 0xd60 && c <= 0xd61) ||
        (c >= 0xe01 && c <= 0xe2e) ||
        c == 0xe30 ||
        (c >= 0xe32 && c <= 0xe33) ||
        (c >= 0xe40 && c <= 0xe45) ||
        (c >= 0xe81 && c <= 0xe82) ||
        c == 0xe84 ||
        (c >= 0xe87 && c <= 0xe88) ||
        c == 0xe8a ||
        c == 0xe8d ||
        (c >= 0xe94 && c <= 0xe97) ||
        (c >= 0xe99 && c <= 0xe9f) ||
        (c >= 0xea1 && c <= 0xea3) ||
        c == 0xea5 ||
        c == 0xea7 ||
        (c >= 0xeaa && c <= 0xeab) ||
        (c >= 0xead && c <= 0xeae) ||
        c == 0xeb0 ||
        (c >= 0xeb2 && c <= 0xeb3) ||
        c == 0xebd ||
        (c >= 0xec0 && c <= 0xec4) ||
        (c >= 0xf40 && c <= 0xf47) ||
        (c >= 0xf49 && c <= 0xf69) ||
        (c >= 0x10a0 && c <= 0x10c5) ||
        (c >= 0x10d0 && c <= 0x10f6) ||
        c == 0x1100 ||
        (c >= 0x1102 && c <= 0x1103) ||
        (c >= 0x1105 && c <= 0x1107) ||
        c == 0x1109 ||
        (c >= 0x110b && c <= 0x110c) ||
        (c >= 0x110e && c <= 0x1112) ||
        c == 0x113c ||
        c == 0x113e ||
        c == 0x1140 ||
        c == 0x114c ||
        c == 0x114e ||
        c == 0x1150 ||
        (c >= 0x1154 && c <= 0x1155) ||
        c == 0x1159 ||
        (c >= 0x115f && c <= 0x1161) ||
        c == 0x1163 ||
        c == 0x1165 ||
        c == 0x1167 ||
        c == 0x1169 ||
        (c >= 0x116d && c <= 0x116e) ||
        (c >= 0x1172 && c <= 0x1173) ||
        c == 0x1175 ||
        c == 0x119e ||
        c == 0x11a8 ||
        c == 0x11ab ||
        (c >= 0x11ae && c <= 0x11af) ||
        (c >= 0x11b7 && c <= 0x11b8) ||
        c == 0x11ba ||
        (c >= 0x11bc && c <= 0x11c2) ||
        c == 0x11eb ||
        c == 0x11f0 ||
        c == 0x11f9 ||
        (c >= 0x1e00 && c <= 0x1e9b) ||
        (c >= 0x1ea0 && c <= 0x1ef9) ||
        (c >= 0x1f00 && c <= 0x1f15) ||
        (c >= 0x1f18 && c <= 0x1f1d) ||
        (c >= 0x1f20 && c <= 0x1f45) ||
        (c >= 0x1f48 && c <= 0x1f4d) ||
        (c >= 0x1f50 && c <= 0x1f57) ||
        c == 0x1f59 ||
        c == 0x1f5b ||
        c == 0x1f5d ||
        (c >= 0x1f5f && c <= 0x1f7d) ||
        (c >= 0x1f80 && c <= 0x1fb4) ||
        (c >= 0x1fb6 && c <= 0x1fbc) ||
        c == 0x1fbe ||
        (c >= 0x1fc2 && c <= 0x1fc4) ||
        (c >= 0x1fc6 && c <= 0x1fcc) ||
        (c >= 0x1fd0 && c <= 0x1fd3) ||
        (c >= 0x1fd6 && c <= 0x1fdb) ||
        (c >= 0x1fe0 && c <= 0x1fec) ||
        (c >= 0x1ff2 && c <= 0x1ff4) ||
        (c >= 0x1ff6 && c <= 0x1ffc) ||
        c == 0x2126 ||
        (c >= 0x212a && c <= 0x212b) ||
        c == 0x212e ||
        (c >= 0x2180 && c <= 0x2182) ||
        (c >= 0x3041 && c <= 0x3094) ||
        (c >= 0x30a1 && c <= 0x30fa) ||
        (c >= 0x3105 && c <= 0x312c) ||
        (c >= 0xac00 && c <= 0xd7a3) ||
        (c >= 0x4e00 && c <= 0x9fa5) ||
        c == 0x3007 ||
        (c >= 0x3021 && c <= 0x3029) ||
        (c >= 0x4e00 && c <= 0x9fa5) ||
        c == 0x3007 ||
        (c >= 0x3021 && c <= 0x3029));
}